

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O1

int __thiscall front::symbol::ArraySymbol::getSize(ArraySymbol *this)

{
  NodeType NVar1;
  pointer psVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  element_type *peVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  pointer psVar9;
  
  if (-1 < this->_size) {
    return this->_size;
  }
  psVar2 = (this->_dimensions).
           super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar8 = 1;
  for (psVar9 = (this->_dimensions).
                super__Vector_base<std::shared_ptr<front::express::ExpressNode>,_std::allocator<std::shared_ptr<front::express::ExpressNode>_>_>
                ._M_impl.super__Vector_impl_data._M_start; bVar6 = psVar9 == psVar2, !bVar6;
      psVar9 = psVar9 + 1) {
    peVar3 = (psVar9->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    p_Var4 = (psVar9->super___shared_ptr<front::express::ExpressNode,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
    }
    NVar1 = peVar3->_type;
    if (NVar1 == CNS) {
      iVar8 = iVar8 * peVar3->_value;
    }
    else {
      this->_size = 0;
    }
    if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
    }
    if (NVar1 != CNS) break;
  }
  iVar7 = 0;
  if (bVar6) {
    peVar5 = (this->_item).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    p_Var4 = (this->_item).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var4 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this->_size = iVar8 * *(int *)&peVar5[1]._name._M_dataplus._M_p;
    }
    else {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      }
      this->_size = iVar8 * *(int *)&peVar5[1]._name._M_dataplus._M_p;
      if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
      }
    }
    iVar7 = this->_size;
  }
  return iVar7;
}

Assistant:

int getSize() {
    if (_size >= 0) {
      return _size;
    } else {
      int size = 1;
      for (SharedExNdPtr i : _dimensions) {
        if (i->_type == front::express::NodeType::CNS) {
          size *= i->_value;
        } else {
          _size = 0;
          return _size;
        }
      }
      _size = size * static_pointer_cast<IntSymbol>(_item)->getSize();
      return _size;
    }
  }